

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core.hpp
# Opt level: O0

void __thiscall
iutest::detail::TestInstance<iu_ParamMethodTestFixed_x_Test_EQ245>::TestInstance
          (TestInstance<iu_ParamMethodTestFixed_x_Test_EQ245> *this,string *testsuite,char *name,
          char *value_params,TestTypeId id,SetUpMethod setup,TearDownMethod teardown)

{
  char *__s;
  TestSuite *pTVar1;
  UnitTest *this_00;
  allocator<char> local_59;
  string local_58;
  SetUpMethod local_38;
  SetUpMethod setup_local;
  TestTypeId id_local;
  char *value_params_local;
  char *name_local;
  string *testsuite_local;
  TestInstance<iu_ParamMethodTestFixed_x_Test_EQ245> *this_local;
  
  local_38 = setup;
  setup_local = (SetUpMethod)id;
  id_local = value_params;
  value_params_local = name;
  name_local = (char *)testsuite;
  testsuite_local = (string *)this;
  pTVar1 = AddTestSuite(this,testsuite,id,setup,teardown);
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,pTVar1);
  __s = value_params_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_58,
                     &(this->m_factory).super_iuFactoryBase);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  iuFactory<iu_ParamMethodTestFixed_x_Test_EQ245>::iuFactory(&this->m_factory);
  TestInfo::set_value_param(&this->m_info,(char *)id_local);
  this_00 = UnitTest::instance();
  pTVar1 = iuITestSuiteMediator::ptr((iuITestSuiteMediator *)this);
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,pTVar1,&this->m_info);
  return;
}

Assistant:

TestInstance(const ::std::string& testsuite, const char* name, const char*  value_params, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown)
        : m_mediator(AddTestSuite(testsuite, id, setup, teardown))
        , m_info(&m_mediator, name, &m_factory)
    {
        m_info.set_value_param(value_params);
        UnitTest::instance().AddTestInfo(m_mediator.ptr(), &m_info);
    }